

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LoopLayerParams::LoopLayerParams(LoopLayerParams *this,LoopLayerParams *from)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  Arena *pAVar4;
  NeuralNetwork *pNVar5;
  LoopLayerParams *from_local;
  LoopLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LoopLayerParams_006f3140;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->conditionvar_,psVar2);
  _internal_conditionvar_abi_cxx11_(from);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar2 = _internal_conditionvar_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->conditionvar_,psVar2,pAVar4);
  }
  bVar1 = _internal_has_conditionnetwork(from);
  if (bVar1) {
    pNVar5 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar5,from->conditionnetwork_);
    this->conditionnetwork_ = pNVar5;
  }
  else {
    this->conditionnetwork_ = (NeuralNetwork *)0x0;
  }
  bVar1 = _internal_has_bodynetwork(from);
  if (bVar1) {
    pNVar5 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(pNVar5,from->bodynetwork_);
    this->bodynetwork_ = pNVar5;
  }
  else {
    this->bodynetwork_ = (NeuralNetwork *)0x0;
  }
  this->maxloopiterations_ = from->maxloopiterations_;
  return;
}

Assistant:

LoopLayerParams::LoopLayerParams(const LoopLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  conditionvar_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    conditionvar_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_conditionvar().empty()) {
    conditionvar_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_conditionvar(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_conditionnetwork()) {
    conditionnetwork_ = new ::CoreML::Specification::NeuralNetwork(*from.conditionnetwork_);
  } else {
    conditionnetwork_ = nullptr;
  }
  if (from._internal_has_bodynetwork()) {
    bodynetwork_ = new ::CoreML::Specification::NeuralNetwork(*from.bodynetwork_);
  } else {
    bodynetwork_ = nullptr;
  }
  maxloopiterations_ = from.maxloopiterations_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LoopLayerParams)
}